

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight::SerializeWithCachedSizes
          (BayesianProbitRegressor_FeatureValueWeight *this,CodedOutputStream *output)

{
  if (this->featurevalue_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(1,this->featurevalue_,output);
  }
  if (this->featureweight_ != (BayesianProbitRegressor_Gaussian *)0x0 &&
      this != (BayesianProbitRegressor_FeatureValueWeight *)
              &_BayesianProbitRegressor_FeatureValueWeight_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&this->featureweight_->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void BayesianProbitRegressor_FeatureValueWeight::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.BayesianProbitRegressor.FeatureValueWeight)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint32 featureValue = 1;
  if (this->featurevalue() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(1, this->featurevalue(), output);
  }

  // .CoreML.Specification.BayesianProbitRegressor.Gaussian featureWeight = 2;
  if (this->has_featureweight()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *this->featureweight_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.BayesianProbitRegressor.FeatureValueWeight)
}